

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_inet_pton(int af,char *src,void *dst)

{
  void *pvVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  int gapLen;
  int nToMove;
  long r;
  char *next;
  uint local_88;
  uint uStack_84;
  char more_1;
  uint byte4;
  uint byte3;
  uint byte2;
  uint byte1;
  char *eow;
  char *dot;
  int local_60;
  int setWords;
  int i;
  int gapPos;
  uint16_t words [8];
  in6_addr *out;
  in_addr *addr;
  uint local_30;
  uint uStack_2c;
  char more;
  uint d;
  uint c;
  uint b;
  uint a;
  void *dst_local;
  char *src_local;
  int af_local;
  
  _b = dst;
  dst_local = src;
  src_local._0_4_ = af;
  if (af == 2) {
    iVar2 = __isoc99_sscanf(src,"%u.%u.%u.%u%c",&c,&d,&stack0xffffffffffffffd4,&local_30,
                            (long)&addr + 7);
    if (iVar2 == 4) {
      if (c < 0x100) {
        if (d < 0x100) {
          if (uStack_2c < 0x100) {
            if (local_30 < 0x100) {
              uVar3 = htonl(c << 0x18 | d << 0x10 | uStack_2c << 8 | local_30);
              *(uint32_t *)dst = uVar3;
              src_local._4_4_ = 1;
            }
            else {
              src_local._4_4_ = 0;
            }
          }
          else {
            src_local._4_4_ = 0;
          }
        }
        else {
          src_local._4_4_ = 0;
        }
      }
      else {
        src_local._4_4_ = 0;
      }
    }
    else {
      src_local._4_4_ = 0;
    }
  }
  else if (af == 10) {
    setWords = -1;
    dot._4_4_ = 0;
    words._8_8_ = dst;
    eow = strchr(src,0x2e);
    pvVar1 = dst_local;
    if (eow == (char *)dst_local) {
      src_local._4_4_ = 0;
    }
    else {
      _byte2 = eow;
      if (eow == (char *)0x0) {
        sVar5 = strlen((char *)dst_local);
        _byte2 = (char *)((long)pvVar1 + sVar5);
      }
      else {
        do {
          _byte2 = _byte2 + -1;
          bVar7 = false;
          if (dst_local <= _byte2) {
            iVar2 = EVUTIL_ISDIGIT_(*_byte2);
            bVar7 = iVar2 != 0;
          }
        } while (bVar7);
        _byte2 = _byte2 + 1;
        iVar2 = __isoc99_sscanf(_byte2,"%u.%u.%u.%u%c",&byte3,&byte4,&stack0xffffffffffffff7c,
                                &local_88,(long)&next + 7);
        if (iVar2 != 4) {
          return 0;
        }
        if ((((0xff < byte3) || (0xff < byte4)) || (0xff < uStack_84)) || (0xff < local_88)) {
          return 0;
        }
        words[2] = (ushort)(byte3 << 8) | (ushort)byte4;
        words[3] = (ushort)(uStack_84 << 8) | (ushort)local_88;
        dot._4_4_ = dot._4_4_ + 2;
      }
      local_60 = 0;
      while (dst_local < _byte2) {
        if (7 < local_60) {
          return 0;
        }
        iVar2 = EVUTIL_ISXDIGIT_(*dst_local);
        if (iVar2 == 0) {
          if (((*dst_local == ':') && (0 < local_60)) && (setWords == -1)) {
            dst_local = (void *)((long)dst_local + 1);
          }
          else {
            if (((*dst_local != ':') || (local_60 != 0)) ||
               ((*(char *)((long)dst_local + 1) != ':' || (setWords != -1)))) {
              return 0;
            }
            dst_local = (void *)((long)dst_local + 2);
          }
          setWords = local_60;
        }
        else {
          lVar6 = strtol((char *)dst_local,(char **)&r,0x10);
          if ((long)dst_local + 4U < (ulong)r) {
            return 0;
          }
          if ((void *)r == dst_local) {
            return 0;
          }
          if ((lVar6 < 0) || (0x10000 < lVar6)) {
            return 0;
          }
          *(short *)((long)&i + (long)local_60 * 2) = (short)lVar6;
          dot._4_4_ = dot._4_4_ + 1;
          if ((*(char *)r != ':') && ((char *)r != _byte2)) {
            return 0;
          }
          dst_local = (void *)(r + 1);
          local_60 = local_60 + 1;
        }
      }
      if (((dot._4_4_ < 9) && ((dot._4_4_ != 8 || (setWords == -1)))) &&
         ((7 < dot._4_4_ || (setWords != -1)))) {
        if (-1 < setWords) {
          iVar2 = 0;
          if (eow != (char *)0x0) {
            iVar2 = 2;
          }
          iVar2 = (dot._4_4_ - iVar2) - setWords;
          iVar4 = 8 - dot._4_4_;
          if (iVar2 < 0) {
            return -1;
          }
          memmove((void *)((long)&i + (long)(setWords + iVar4) * 2),
                  (void *)((long)&i + (long)setWords * 2),(long)iVar2 << 1);
          memset((void *)((long)&i + (long)setWords * 2),0,(long)iVar4 << 1);
        }
        for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
          *(char *)(words._8_8_ + (long)(local_60 << 1)) =
               (char)((ushort)*(undefined2 *)((long)&i + (long)local_60 * 2) >> 8);
          *(char *)(words._8_8_ + (long)(local_60 * 2 + 1)) =
               (char)*(undefined2 *)((long)&i + (long)local_60 * 2);
        }
        src_local._4_4_ = 1;
      }
      else {
        src_local._4_4_ = 0;
      }
    }
  }
  else {
    src_local._4_4_ = -1;
  }
  return src_local._4_4_;
}

Assistant:

int
evutil_inet_pton(int af, const char *src, void *dst)
{
#if defined(EVENT__HAVE_INET_PTON) && !defined(USE_INTERNAL_PTON)
	return inet_pton(af, src, dst);
#else
	if (af == AF_INET) {
		unsigned a,b,c,d;
		char more;
		struct in_addr *addr = dst;
		if (sscanf(src, "%u.%u.%u.%u%c", &a,&b,&c,&d,&more) != 4)
			return 0;
		if (a > 255) return 0;
		if (b > 255) return 0;
		if (c > 255) return 0;
		if (d > 255) return 0;
		addr->s_addr = htonl((a<<24) | (b<<16) | (c<<8) | d);
		return 1;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		struct in6_addr *out = dst;
		ev_uint16_t words[8];
		int gapPos = -1, i, setWords=0;
		const char *dot = strchr(src, '.');
		const char *eow; /* end of words. */
		if (dot == src)
			return 0;
		else if (!dot)
			eow = src+strlen(src);
		else {
			unsigned byte1,byte2,byte3,byte4;
			char more;
			for (eow = dot-1; eow >= src && EVUTIL_ISDIGIT_(*eow); --eow)
				;
			++eow;

			/* We use "scanf" because some platform inet_aton()s are too lax
			 * about IPv4 addresses of the form "1.2.3" */
			if (sscanf(eow, "%u.%u.%u.%u%c",
					   &byte1,&byte2,&byte3,&byte4,&more) != 4)
				return 0;

			if (byte1 > 255 ||
			    byte2 > 255 ||
			    byte3 > 255 ||
			    byte4 > 255)
				return 0;

			words[6] = (byte1<<8) | byte2;
			words[7] = (byte3<<8) | byte4;
			setWords += 2;
		}

		i = 0;
		while (src < eow) {
			if (i > 7)
				return 0;
			if (EVUTIL_ISXDIGIT_(*src)) {
				char *next;
				long r = strtol(src, &next, 16);
				if (next > 4+src)
					return 0;
				if (next == src)
					return 0;
				if (r<0 || r>65536)
					return 0;

				words[i++] = (ev_uint16_t)r;
				setWords++;
				src = next;
				if (*src != ':' && src != eow)
					return 0;
				++src;
			} else if (*src == ':' && i > 0 && gapPos==-1) {
				gapPos = i;
				++src;
			} else if (*src == ':' && i == 0 && src[1] == ':' && gapPos==-1) {
				gapPos = i;
				src += 2;
			} else {
				return 0;
			}
		}

		if (setWords > 8 ||
			(setWords == 8 && gapPos != -1) ||
			(setWords < 8 && gapPos == -1))
			return 0;

		if (gapPos >= 0) {
			int nToMove = setWords - (dot ? 2 : 0) - gapPos;
			int gapLen = 8 - setWords;
			/* assert(nToMove >= 0); */
			if (nToMove < 0)
				return -1; /* should be impossible */
			memmove(&words[gapPos+gapLen], &words[gapPos],
					sizeof(ev_uint16_t)*nToMove);
			memset(&words[gapPos], 0, sizeof(ev_uint16_t)*gapLen);
		}
		for (i = 0; i < 8; ++i) {
			out->s6_addr[2*i  ] = words[i] >> 8;
			out->s6_addr[2*i+1] = words[i] & 0xff;
		}

		return 1;
#endif
	} else {
		return -1;
	}
#endif
}